

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

Abc_Cex_t * Abc_CexPermute(Abc_Cex_t *p,Vec_Int_t *vMapOld2New)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Abc_Cex_t *pAVar6;
  int local_24;
  int iNew;
  int i;
  Abc_Cex_t *pCex;
  Vec_Int_t *vMapOld2New_local;
  Abc_Cex_t *p_local;
  
  iVar4 = Vec_IntSize(vMapOld2New);
  if (iVar4 == p->nPis) {
    pAVar6 = Abc_CexAlloc(p->nRegs,p->nPis,p->iFrame + 1);
    pAVar6->iPo = p->iPo;
    pAVar6->iFrame = p->iFrame;
    for (local_24 = p->nRegs; local_24 < p->nBits; local_24 = local_24 + 1) {
      iVar4 = Abc_InfoHasBit((uint *)(p + 1),local_24);
      if (iVar4 != 0) {
        iVar4 = p->nRegs;
        iVar1 = p->nPis;
        iVar2 = p->nRegs;
        iVar3 = p->nPis;
        iVar5 = Vec_IntEntry(vMapOld2New,(local_24 - p->nRegs) % p->nPis);
        Abc_InfoSetBit((uint *)(pAVar6 + 1),iVar4 + iVar1 * ((local_24 - iVar2) / iVar3) + iVar5);
      }
    }
    return pAVar6;
  }
  __assert_fail("Vec_IntSize(vMapOld2New) == p->nPis",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilCex.c"
                ,0x1eb,"Abc_Cex_t *Abc_CexPermute(Abc_Cex_t *, Vec_Int_t *)");
}

Assistant:

Abc_Cex_t * Abc_CexPermute( Abc_Cex_t * p, Vec_Int_t * vMapOld2New )
{
    Abc_Cex_t * pCex;
    int i, iNew;
    assert( Vec_IntSize(vMapOld2New) == p->nPis );
    pCex = Abc_CexAlloc( p->nRegs, p->nPis, p->iFrame+1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = p->iFrame;
    for ( i = p->nRegs; i < p->nBits; i++ )
        if ( Abc_InfoHasBit(p->pData, i) )
        {
            iNew = p->nRegs + p->nPis * ((i - p->nRegs) / p->nPis) + Vec_IntEntry( vMapOld2New, (i - p->nRegs) % p->nPis );
            Abc_InfoSetBit( pCex->pData, iNew );
        }
    return pCex;
}